

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_exporter.cpp
# Opt level: O0

void __thiscall Assimp::JSONWriter::~JSONWriter(JSONWriter *this)

{
  JSONWriter *this_local;
  
  Flush(this);
  std::__cxx11::stringstream::~stringstream((stringstream *)&this->buff);
  std::__cxx11::string::~string((string *)&this->newline);
  std::__cxx11::string::~string((string *)&this->indent);
  return;
}

Assistant:

~JSONWriter() {
        Flush();
    }